

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
eglu::attribMapToList(vector<int,_std::allocator<int>_> *__return_storage_ptr__,AttribMap *attribs)

{
  iterator iVar1;
  _Rb_tree_node_base *p_Var2;
  int local_1c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var2 = (attribs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(attribs->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,(int *)(p_Var2 + 1)
                );
    }
    else {
      *iVar1._M_current = p_Var2[1]._M_color;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,
                 (int *)&p_Var2[1].field_0x4);
    }
    else {
      *iVar1._M_current = *(int *)&p_Var2[1].field_0x4;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  local_1c = 0x3038;
  iVar1._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (__return_storage_ptr__,iVar1,&local_1c);
  }
  else {
    *iVar1._M_current = 0x3038;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> attribMapToList (const AttribMap& attribs)
{
	vector<EGLint> attribList;

	for (AttribMap::const_iterator it = attribs.begin(); it != attribs.end(); ++it)
	{
		attribList.push_back(it->first);
		attribList.push_back(it->second);
	}

	attribList.push_back(EGL_NONE);

	return attribList;
}